

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

void __thiscall
pbrt::KdTreeAggregate::KdTreeAggregate
          (KdTreeAggregate *this,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *p,int isectCost,
          int traversalCost,Float emptyBonus,int maxPrims,int maxDepth)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  type piVar4;
  vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *this_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  int *unaff_retaddr;
  int *in_stack_00000008;
  int in_stack_00000010;
  size_t i_1;
  unique_ptr<int[],_std::default_delete<int[]>_> primNums;
  unique_ptr<int[],_std::default_delete<int[]>_> prims1;
  unique_ptr<int[],_std::default_delete<int[]>_> prims0;
  int i;
  unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> edges [3];
  Bounds3f b;
  PrimitiveHandle *prim;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *__range1;
  vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> primBounds;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *in_stack_fffffffffffffe40;
  _Head_base<0UL,_pbrt::BoundEdge_*,_false> *this_01;
  value_type *in_stack_fffffffffffffe48;
  vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  Bounds3<float> *in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *in_stack_fffffffffffffe70;
  Bounds3<float> *in_stack_fffffffffffffe88;
  _Head_base<0UL,_pbrt::BoundEdge_*,_false> *p_Var7;
  Bounds3<float> *in_stack_fffffffffffffe90;
  _Head_base<0UL,_pbrt::BoundEdge_*,_false> *p_Var8;
  _Head_base<0UL,_pbrt::BoundEdge_*,_false> *local_118;
  ulong local_e8;
  int local_bc;
  _Head_base<0UL,_pbrt::BoundEdge_*,_false> local_b8 [3];
  _Head_base<0UL,_pbrt::BoundEdge_*,_false> local_a0;
  BoundEdge *pBStack_98;
  BoundEdge *local_90;
  reference local_70;
  PrimitiveHandle *local_68;
  __normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
  local_60;
  unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *puVar9;
  int *in_stack_ffffffffffffffb0;
  vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *in_stack_ffffffffffffffb8;
  Bounds3f *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  KdTreeAggregate *in_stack_ffffffffffffffd0;
  int depth;
  unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *edges_00;
  
  *(undefined4 *)
   &(in_RDI->_M_t).super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
    _M_t.super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
    super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl = in_EDX;
  *(undefined4 *)
   ((long)&(in_RDI->_M_t).
           super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
           super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
           super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl + 4) = in_ECX;
  *(undefined4 *)
   &in_RDI[1]._M_t.super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
    _M_t.super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
    super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl = in_R8D;
  auVar5 = (undefined1  [12])0x0;
  *(undefined4 *)
   ((long)&in_RDI[1]._M_t.
           super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
           super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
           super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl + 4) = in_XMM0_Da;
  edges_00 = in_RDI;
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::vector
            (in_stack_fffffffffffffe40,
             (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7bf463);
  Bounds3<float>::Bounds3(in_stack_fffffffffffffe60);
  *(undefined4 *)
   &in_RDI[9]._M_t.super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
    _M_t.super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
    super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl = 0;
  *(undefined4 *)
   ((long)&in_RDI[9]._M_t.
           super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
           super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
           super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl + 4) = 0;
  if (in_R9D < 1) {
    std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::size
              ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)(in_RDI + 2)
              );
    iVar2 = Log2Int(0x7bf4b3);
    auVar6._0_4_ = (float)iVar2;
    auVar6._4_12_ = auVar5;
    auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3fa66666),0),auVar6,SUB6416(ZEXT464(0x41000000),0));
    std::round(auVar6._0_8_);
  }
  std::vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>::vector
            ((vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *)0x7bf530);
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::size
            ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)(in_RDI + 2));
  std::vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>::reserve
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  puVar9 = in_RDI + 2;
  local_60._M_current =
       (PrimitiveHandle *)
       std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::begin
                 ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_68 = (PrimitiveHandle *)
             std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::end
                       ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                        CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    if (!bVar1) break;
    local_70 = __gnu_cxx::
               __normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
               ::operator*(&local_60);
    PrimitiveHandle::Bounds((PrimitiveHandle *)in_stack_fffffffffffffe40);
    Union<float>(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    in_RDI[0xc]._M_t.super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
    ._M_t.super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
    super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl = local_90;
    in_RDI[10]._M_t.super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
    _M_t.super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
    super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl = local_a0._M_head_impl;
    in_RDI[0xb]._M_t.super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
    ._M_t.super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
    super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl = pBStack_98;
    std::vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>::push_back
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    __gnu_cxx::
    __normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
    ::operator++(&local_60);
  }
  local_118 = local_b8;
  do {
    std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>::
    unique_ptr<std::default_delete<pbrt::BoundEdge[]>,void>
              ((unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *)
               in_stack_fffffffffffffe40);
    local_118 = local_118 + 1;
  } while (local_118 != &local_a0);
  for (local_bc = 0; local_bc < 3; local_bc = local_bc + 1) {
    std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::size
              ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)(in_RDI + 2)
              );
    std::make_unique<pbrt::BoundEdge[]>((size_t)in_stack_fffffffffffffe88);
    std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::operator=
              ((unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *)
               in_stack_fffffffffffffe40,
               (unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::~unique_ptr
              ((unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *)
               in_stack_fffffffffffffe40);
  }
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::size
            ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)(in_RDI + 2));
  std::make_unique<int[]>(CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::size
            ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)(in_RDI + 2));
  std::make_unique<int[]>(CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::size
            ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)(in_RDI + 2));
  std::make_unique<int[]>(CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_e8 = 0;
  while( true ) {
    sVar3 = std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::size
                      ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                       (in_RDI + 2));
    iVar2 = (int)((ulong)puVar9 >> 0x20);
    depth = (int)in_RSI;
    if (sVar3 <= local_e8) break;
    piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_fffffffffffffe40,
                        CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    *piVar4 = (int)local_e8;
    local_e8 = local_e8 + 1;
  }
  std::unique_ptr<int[],_std::default_delete<int[]>_>::get
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_fffffffffffffe40);
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::size
            ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)(in_RDI + 2));
  std::unique_ptr<int[],_std::default_delete<int[]>_>::get
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_fffffffffffffe40);
  this_00 = (vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *)
            std::unique_ptr<int[],_std::default_delete<int[]>_>::get
                      ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_fffffffffffffe40);
  this_01 = local_b8;
  buildTree(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
            in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar2,depth,edges_00,unaff_retaddr,
            in_stack_00000008,in_stack_00000010);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)this_01);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)this_01);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)this_01);
  p_Var7 = local_b8;
  p_Var8 = &local_a0;
  do {
    p_Var8 = p_Var8 + -1;
    std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::~unique_ptr
              ((unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *)this_01);
  } while (p_Var8 != p_Var7);
  std::vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>::~vector(this_00);
  return;
}

Assistant:

KdTreeAggregate::KdTreeAggregate(std::vector<PrimitiveHandle> p, int isectCost,
                                 int traversalCost, Float emptyBonus, int maxPrims,
                                 int maxDepth)
    : isectCost(isectCost),
      traversalCost(traversalCost),
      maxPrims(maxPrims),
      emptyBonus(emptyBonus),
      primitives(std::move(p)) {
    // Build kd-tree for accelerator
    nextFreeNode = nAllocedNodes = 0;
    if (maxDepth <= 0)
        maxDepth = std::round(8 + 1.3f * Log2Int(int64_t(primitives.size())));
    // Compute bounds for kd-tree construction
    std::vector<Bounds3f> primBounds;
    primBounds.reserve(primitives.size());
    for (PrimitiveHandle &prim : primitives) {
        Bounds3f b = prim.Bounds();
        bounds = Union(bounds, b);
        primBounds.push_back(b);
    }

    // Allocate working memory for kd-tree construction
    std::unique_ptr<BoundEdge[]> edges[3];
    for (int i = 0; i < 3; ++i)
        edges[i] = std::make_unique<BoundEdge[]>(2 * primitives.size());

    std::unique_ptr<int[]> prims0 = std::make_unique<int[]>(primitives.size());
    std::unique_ptr<int[]> prims1 =
        std::make_unique<int[]>((maxDepth + 1) * primitives.size());

    // Initialize _primNums_ for kd-tree construction
    std::unique_ptr<int[]> primNums = std::make_unique<int[]>(primitives.size());
    for (size_t i = 0; i < primitives.size(); ++i)
        primNums[i] = i;

    // Start recursive construction of kd-tree
    buildTree(0, bounds, primBounds, primNums.get(), primitives.size(), maxDepth, edges,
              prims0.get(), prims1.get());
}